

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.c
# Opt level: O0

void fwrite32le(FILE *fp,uint32_t w)

{
  undefined4 in_ESI;
  uint8_t le [4];
  void *in_stack_ffffffffffffffe8;
  
  fwritex((FILE *)CONCAT44(in_ESI,in_ESI),in_stack_ffffffffffffffe8,0x10ce1e);
  return;
}

Assistant:

void fwrite32le(FILE *fp,uint32_t w)
/* write a little endian 32 bit word */
{
  uint8_t le[4];

  le[0] = w & 0xff;
  le[1] = (w>>8) & 0xff;
  le[2] = (w>>16) & 0xff;
  le[3] = (w>>24) & 0xff;
  fwritex(fp,le,4);
}